

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cpp
# Opt level: O0

optional<OutputType> __thiscall
anon_unknown.dwarf_1ba5289::SHDescriptor::GetOutputType(SHDescriptor *this)

{
  long lVar1;
  bool bVar2;
  size_type sVar3;
  optional<OutputType> *in_RDI;
  long in_FS_OFFSET;
  SHDescriptor *in_stack_ffffffffffffffc8;
  OutputType *in_stack_ffffffffffffffd0;
  _Optional_base<OutputType,_true,_true> local_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  sVar3 = std::
          vector<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>_>_>
          ::size((vector<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>_>_>
                  *)in_stack_ffffffffffffffc8);
  if (sVar3 != 1) {
    __assert_fail("m_subdescriptor_args.size() == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/descriptor.cpp"
                  ,0x445,
                  "virtual std::optional<OutputType> (anonymous namespace)::SHDescriptor::GetOutputType() const"
                 );
  }
  bVar2 = IsSegwit(in_stack_ffffffffffffffc8);
  if (bVar2) {
    std::optional<OutputType>::optional<OutputType,_true>(in_RDI,in_stack_ffffffffffffffd0);
  }
  else {
    std::optional<OutputType>::optional<OutputType,_true>(in_RDI,in_stack_ffffffffffffffd0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (_Optional_base<OutputType,_true,_true>)
           (_Optional_base<OutputType,_true,_true>)
           local_10._M_payload.super__Optional_payload_base<OutputType>;
  }
  __stack_chk_fail();
}

Assistant:

std::optional<OutputType> GetOutputType() const override
    {
        assert(m_subdescriptor_args.size() == 1);
        if (IsSegwit()) return OutputType::P2SH_SEGWIT;
        return OutputType::LEGACY;
    }